

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

iter_result_opt * __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
::gte_key_byte(iter_result_opt *__return_storage_ptr__,
              basic_inode_48<unodb::detail::basic_art_policy<std::span<const_std::byte,_18446744073709551615UL>,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::olc_db,_unodb::in_critical_section,_unodb::optimistic_lock,_unodb::optimistic_lock::read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::olc_node_header>,_unodb::detail::olc_inode_defs,_unodb::detail::db_inode_qsbr_deleter,_unodb::detail::db_leaf_qsbr_deleter>_>
              *this,byte key_byte)

{
  key_prefix_snapshot kVar1;
  long lVar2;
  ulong uVar3;
  undefined7 in_register_00000011;
  ulong uVar4;
  bool bVar5;
  undefined4 local_e;
  undefined2 local_a;
  
  uVar4 = CONCAT71(in_register_00000011,key_byte);
  if ((this->child_indexes)._M_elems[uVar4 & 0xffffffff].value.super___atomic_base<unsigned_char>.
      _M_i == 0xff) {
    uVar3 = (uVar4 & 0xffffffff) - 1;
    do {
      if (uVar3 == 0xfe) goto LAB_00135552;
      lVar2 = uVar3 + 2;
      uVar3 = uVar3 + 1;
      uVar4 = (ulong)(byte)((char)uVar4 + 1);
    } while ((this->child_indexes)._M_elems[lVar2].value.super___atomic_base<unsigned_char>._M_i ==
             0xff);
    bVar5 = 0xfe < uVar3;
  }
  else {
    bVar5 = false;
  }
  kVar1 = *(key_prefix_snapshot *)&this->field_0x18;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.node.tagged_ptr = (ulong)this | 3;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.key_byte = (byte)uVar4;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.child_index = (byte)uVar4;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
           )._M_payload.
           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
           ._M_payload + 10) = local_e;
  *(undefined2 *)
   ((long)&(__return_storage_ptr__->
           super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
           )._M_payload.
           super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
           ._M_payload + 0xe) = local_a;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_payload._M_value.prefix = kVar1;
  (__return_storage_ptr__->
  super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
  _M_engaged = true;
  if (bVar5) {
LAB_00135552:
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_payload._M_value.node.tagged_ptr = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>
             )._M_payload.
             super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>
             ._M_payload + 8) = 0;
    (__return_storage_ptr__->
    super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
    _M_payload._M_value.prefix.u64 = 0;
    *(undefined8 *)
     &(__return_storage_ptr__->
      super__Optional_base<unodb::detail::iter_result<unodb::detail::olc_node_header>,_true,_true>).
      _M_payload.
      super__Optional_payload_base<unodb::detail::iter_result<unodb::detail::olc_node_header>_>.
      _M_engaged = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_48::iter_result_opt
  gte_key_byte(std::byte key_byte) noexcept {
    // loop over the remaining byte values in lexical order.
    for (auto i = static_cast<std::uint64_t>(key_byte); i < 256; i++) {
      const auto child_index = static_cast<std::uint8_t>(i);
      if (child_indexes[child_index] != empty_child) {
        const auto key = static_cast<std::byte>(i);
        return {{node_ptr{this, node_type::I48}, key, child_index,
                 this->get_key_prefix().get_snapshot()}};
      }
    }
    return parent_class::end_result;
  }